

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtualMemory.c
# Opt level: O2

_Bool sysbvm_virtualMemory_lockCodePagesForWriting
                (void *writePointer,void *executablePointer,size_t size)

{
  int iVar1;
  size_t sVar2;
  _Bool _Var3;
  void *__addr;
  
  _Var3 = true;
  if (writePointer == executablePointer) {
    sVar2 = sysbvm_virtualMemory_getSystemAllocationAlignment();
    __addr = (void *)(-sVar2 & (ulong)writePointer);
    pthread_mutex_lock((pthread_mutex_t *)&codeZoneWriteLock);
    iVar1 = mprotect(__addr,((long)writePointer + sVar2 + size + -1 & -sVar2) - (long)__addr,7);
    if (iVar1 != 0) {
      pthread_mutex_unlock((pthread_mutex_t *)&codeZoneWriteLock);
      _Var3 = false;
    }
  }
  return _Var3;
}

Assistant:

bool sysbvm_virtualMemory_lockCodePagesForWriting(void *writePointer, void *executablePointer, size_t size)
{
    if(writePointer != executablePointer)
        return true;

    size_t pageAlignment = sysbvm_virtualMemory_getSystemAllocationAlignment();
    uintptr_t startAddress = (uintptr_t)executablePointer & (-pageAlignment);
    uintptr_t endAddress = ((uintptr_t)executablePointer + size + pageAlignment - 1) & (-pageAlignment);

    pthread_mutex_lock(&codeZoneWriteLock);
    bool success = mprotect((void*)startAddress, endAddress - startAddress, PROT_READ | PROT_WRITE | PROT_EXEC) == 0;
    if(!success)
        pthread_mutex_unlock(&codeZoneWriteLock);

    return success;
}